

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O0

bool S2::IntersectsRect(R2Point *a,R2Point *b,R2Rect *rect)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  bool local_c1;
  VType local_c0 [2];
  D local_b0;
  double min;
  D local_88;
  double local_78;
  double max;
  int j;
  int i;
  undefined1 local_58 [8];
  R2Point n;
  R2Rect bound;
  R2Rect *rect_local;
  R2Point *b_local;
  R2Point *a_local;
  
  R2Rect::FromPointPair((R2Rect *)(n.c_ + 1),a,b);
  bVar1 = R2Rect::Intersects(rect,(R2Rect *)(n.c_ + 1));
  if (bVar1) {
    _j = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator-
                   ((BasicVector<Vector2,_double,_2UL> *)b,a);
    _local_58 = Vector2<double>::Ortho((Vector2<double> *)&j);
    pdVar2 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)local_58,0);
    max._4_4_ = (uint)(0.0 <= *pdVar2);
    pdVar2 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)local_58,1);
    max._0_4_ = (uint)(0.0 <= *pdVar2);
    _min = R2Rect::GetVertex(rect,max._4_4_,max._0_4_);
    local_88 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator-
                         ((BasicVector<Vector2,_double,_2UL> *)&min,a);
    local_78 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::DotProd
                         ((BasicVector<Vector2,_double,_2UL> *)local_58,&local_88);
    local_c0 = (VType  [2])R2Rect::GetVertex(rect,1 - max._4_4_,1 - max._0_4_);
    local_b0 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator-
                         ((BasicVector<Vector2,_double,_2UL> *)local_c0,a);
    dVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::DotProd
                      ((BasicVector<Vector2,_double,_2UL> *)local_58,&local_b0);
    local_c1 = 0.0 <= local_78 && dVar3 <= 0.0;
    a_local._7_1_ = local_c1;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool IntersectsRect(const R2Point& a, const R2Point& b, const R2Rect& rect) {
  // First check whether the bound of AB intersects "rect".
  R2Rect bound = R2Rect::FromPointPair(a, b);
  if (!rect.Intersects(bound)) return false;

  // Otherwise AB intersects "rect" if and only if all four vertices of "rect"
  // do not lie on the same side of the extended line AB.  We test this by
  // finding the two vertices of "rect" with minimum and maximum projections
  // onto the normal of AB, and computing their dot products with the edge
  // normal.
  R2Point n = (b - a).Ortho();
  int i = (n[0] >= 0) ? 1 : 0;
  int j = (n[1] >= 0) ? 1 : 0;
  double max = n.DotProd(rect.GetVertex(i, j) - a);
  double min = n.DotProd(rect.GetVertex(1-i, 1-j) - a);
  return (max >= 0) && (min <= 0);
}